

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedBlackTree.cpp
# Opt level: O2

void __thiscall RedBlackTree::fixDelete(RedBlackTree *this,Node **node)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *local_38;
  Node *local_30;
  
  pNVar4 = *node;
  if (pNVar4 == (Node *)0x0) {
    return;
  }
  pNVar2 = this->root;
  if (pNVar4 == pNVar2) {
    this->root = (Node *)0x0;
    return;
  }
  pNVar1 = pNVar4->left;
  if (pNVar4->color != 0) {
    if ((pNVar1 != (Node *)0x0) && (pNVar1->color == 0)) goto LAB_00107133;
    if ((pNVar4->right == (Node *)0x0) || (pNVar4->right->color != 0)) {
      pNVar4->color = 2;
      do {
        if ((pNVar4 == pNVar2) || (pNVar4->color != 2)) goto LAB_00107248;
        pNVar1 = pNVar4->parent;
        pNVar2 = pNVar1->left;
        local_30 = pNVar1;
        if (pNVar4 == pNVar2) {
          pNVar2 = pNVar1->right;
          if ((pNVar2 == (Node *)0x0) || (pNVar2->color != 0)) {
            pNVar4 = pNVar2->left;
            if ((pNVar4 == (Node *)0x0) || (pNVar4->color == 1)) {
              pNVar3 = pNVar2->right;
              if ((pNVar3 == (Node *)0x0) || (pNVar3->color == 1)) goto LAB_001070c2;
LAB_001071f6:
              local_38 = pNVar2;
              if (pNVar3->color == 1) {
                if (pNVar4 != (Node *)0x0) goto LAB_00107201;
                goto LAB_00107208;
              }
            }
            else {
              pNVar3 = pNVar2->right;
              if (pNVar3 != (Node *)0x0) goto LAB_001071f6;
LAB_00107201:
              pNVar4->color = 1;
LAB_00107208:
              pNVar2->color = 0;
              local_38 = pNVar2;
              rotateRight(this,&local_38);
              pNVar2 = pNVar1->right;
            }
            pNVar2->color = pNVar1->color;
            pNVar1->color = 1;
            if (pNVar2->right != (Node *)0x0) {
              pNVar2->right->color = 1;
            }
            leftRotate(this,&local_30);
LAB_00107248:
            pNVar4 = (*node)->parent;
            (&pNVar4->left)[*node != pNVar4->left] = (Node *)0x0;
            operator_delete(*node,0x20);
            if (this->root == (Node *)0x0) {
              return;
            }
            this->root->color = 1;
            return;
          }
          pNVar2->color = 1;
          pNVar1->color = 0;
          leftRotate(this,&local_30);
          pNVar1 = pNVar4;
        }
        else {
          if ((pNVar2 == (Node *)0x0) || (pNVar2->color != 0)) {
            pNVar4 = pNVar2->left;
            if ((pNVar4 == (Node *)0x0) || (pNVar4->color == 1)) {
              pNVar3 = pNVar2->right;
              if ((pNVar3 == (Node *)0x0) || (pNVar3->color == 1)) {
LAB_001070c2:
                pNVar2->color = 0;
                if (pNVar1->color == 0) {
                  pNVar1->color = 1;
                }
                else {
                  pNVar1->color = 2;
                }
                goto LAB_001070e5;
              }
              local_38 = pNVar2;
              if (pNVar4 == (Node *)0x0) {
LAB_0010718e:
                pNVar3->color = 1;
              }
              else {
                if (pNVar4->color != 1) goto LAB_001071a9;
                pNVar3 = pNVar2->right;
                if (pNVar3 != (Node *)0x0) goto LAB_0010718e;
              }
              pNVar2->color = 0;
              leftRotate(this,&local_38);
              pNVar2 = pNVar1->left;
            }
LAB_001071a9:
            pNVar2->color = pNVar1->color;
            pNVar1->color = 1;
            if (pNVar2->left != (Node *)0x0) {
              pNVar2->left->color = 1;
            }
            rotateRight(this,&local_30);
            goto LAB_00107248;
          }
          pNVar2->color = 1;
          pNVar1->color = 0;
          rotateRight(this,&local_30);
          pNVar1 = pNVar4;
        }
LAB_001070e5:
        pNVar2 = this->root;
        pNVar4 = pNVar1;
      } while( true );
    }
  }
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = pNVar4->right;
  }
LAB_00107133:
  pNVar2 = pNVar4->parent;
  if (pNVar4 == pNVar2->left) {
    pNVar2->left = pNVar1;
  }
  else {
    pNVar2->right = pNVar1;
  }
  if (pNVar1 != (Node *)0x0) {
    pNVar1->parent = (*node)->parent;
    pNVar1->color = 1;
  }
  operator_delete(*node,0x20);
  return;
}

Assistant:

void RedBlackTree::fixDelete(Node *&node) {
    if (node == nullptr) {
        return;
    }

    if (node == root) {
        root = nullptr;
        return;
    }
    if (getColor(node) == RED || getColor(node->left) == RED || getColor(node->right) == RED) {
        Node *child = node->left != nullptr ? node->left : node->right;

        if (node == node->parent->left) {
            node->parent->left = child;
            if (child != nullptr) {
                child->parent = node->parent;
            }
            setColor(child, BLACK);
            delete (node);
        } else {
            node->parent->right = child;
            if (child != nullptr) {
                child->parent = node->parent;
            }
            setColor(child, BLACK);
            delete (node);
        }
    } else {
        Node *sibling = nullptr;
        Node *parent = nullptr;
        Node *ptr = node;
        setColor(ptr, DOUBLE_BLACK);
        while (ptr != root && getColor(ptr) == DOUBLE_BLACK) {
            parent = ptr->parent;
            if (ptr == parent->left) {
                sibling = parent->right;
                if (getColor(sibling) == RED) {
                    setColor(sibling, BLACK);
                    setColor(parent, RED);
                    leftRotate(parent);
                } else {
                    if (getColor(sibling->left) == BLACK && getColor(sibling->right) == BLACK) {
                        setColor(sibling, RED);
                        if (getColor(parent) == RED) {
                            setColor(parent, BLACK);
                        } else {
                            setColor(parent, DOUBLE_BLACK);
                        }
                        ptr = parent;
                    } else {
                        if (getColor(sibling->right) == BLACK) {
                            setColor(sibling->left, BLACK);
                            setColor(sibling, RED);
                            rotateRight(sibling);
                            sibling = parent->right;
                        }
                        setColor(sibling, parent->color);
                        setColor(parent, BLACK);
                        setColor(sibling->right, BLACK);
                        leftRotate(parent);
                        break;
                    }
                }
            } else {
                sibling = parent->left;
                if (getColor(sibling) == RED) {
                    setColor(sibling, BLACK);
                    setColor(parent, RED);
                    rotateRight(parent);
                } else {
                    if (getColor(sibling->left) == BLACK && getColor(sibling->right) == BLACK) {
                        setColor(sibling, RED);
                        if (getColor(parent) == RED) {
                            setColor(parent, BLACK);
                        } else {
                            setColor(parent, DOUBLE_BLACK);
                        }
                        ptr = parent;
                    } else {
                        if (getColor(sibling->left) == BLACK) {
                            setColor(sibling->right, BLACK);
                            setColor(sibling, RED);
                            leftRotate(sibling);
                            sibling = parent->left;
                        }
                        setColor(sibling, parent->color);
                        setColor(parent, BLACK);
                        setColor(sibling->left, BLACK);
                        rotateRight(parent);
                        break;
                    }
                }
            }
        }
        if (node == node->parent->left) {
            node->parent->left = nullptr;
        } else {
            node->parent->right = nullptr;
        }
        delete (node);
        setColor(root, BLACK);
    }
}